

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

LengthPercentageAuto
Rml::ComputeLengthPercentageAuto
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  NumericValue value;
  float fVar1;
  float dp_ratio_local;
  float document_font_size_local;
  float font_size_local;
  Property *property_local;
  Vector2f vp_dimensions_local;
  
  if (property->unit == PERCENT) {
    fVar1 = Property::Get<float>(property);
    Style::LengthPercentageAuto::LengthPercentageAuto
              ((LengthPercentageAuto *)&vp_dimensions_local,Percentage,fVar1);
  }
  else if (property->unit == KEYWORD) {
    Style::LengthPercentageAuto::LengthPercentageAuto
              ((LengthPercentageAuto *)&vp_dimensions_local,Auto,0.0);
  }
  else {
    value = Property::GetNumericValue(property);
    fVar1 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
    Style::LengthPercentageAuto::LengthPercentageAuto
              ((LengthPercentageAuto *)&vp_dimensions_local,Length,fVar1);
  }
  return (LengthPercentageAuto)vp_dimensions_local;
}

Assistant:

Style::LengthPercentageAuto ComputeLengthPercentageAuto(const Property* property, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	using namespace Style;
	if (property->unit == Unit::PERCENT)
		return LengthPercentageAuto(LengthPercentageAuto::Percentage, property->Get<float>());
	else if (property->unit == Unit::KEYWORD)
		return LengthPercentageAuto(LengthPercentageAuto::Auto);

	return LengthPercentageAuto(LengthPercentageAuto::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}